

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O2

char * duckdb::Highlighting::GetColorOption(char *option)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x100) {
      return (char *)0x0;
    }
    iVar2 = strcmp(*(char **)((long)&terminal_colors + lVar3),option);
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return *(char **)((long)&PTR_anon_var_dwarf_23274_01776ec8 + lVar3);
}

Assistant:

const char *Highlighting::GetColorOption(const char *option) {
	size_t index = 0;
	while (terminal_colors[index].color_name) {
		if (strcmp(terminal_colors[index].color_name, option) == 0) {
			return terminal_colors[index].highlight;
		}
		index++;
	}
	return nullptr;
}